

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast2json.cc
# Opt level: O0

int ProgramMain(int argc,char **argv)

{
  string_view module_filename_noext;
  FILE *file;
  bool bVar1;
  Enum EVar2;
  uchar *size;
  pointer lexer_00;
  ulong uVar3;
  pointer pSVar4;
  pointer log_stream;
  pointer pFVar5;
  pointer this;
  pointer line_finder_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  size_type extraout_RDX;
  string_view filename;
  string_view filename_00;
  string_view filename_01;
  string local_1f8;
  undefined1 local_1d8 [8];
  unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  line_finder;
  string_view local_1c8;
  __normal_iterator<wabt::FilenameMemoryStreamPair_*,_std::vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>_>
  local_1b8;
  __normal_iterator<wabt::FilenameMemoryStreamPair_*,_std::vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>_>
  local_1b0;
  iterator iter;
  string_view local_1a0;
  string_view local_190;
  string_view local_180;
  Enum local_16c;
  string_view local_168;
  string_view local_158;
  undefined1 local_148 [8];
  string output_basename;
  MemoryStream json_stream;
  vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
  module_streams;
  string local_d8;
  Enum local_b4;
  Enum local_b0;
  undefined1 local_ac [8];
  ValidateOptions options;
  undefined1 local_95 [8];
  WastParseOptions parse_wast_options;
  unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> script;
  Errors errors;
  string_view local_60;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> local_50;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> lexer;
  char *local_40;
  Result local_34;
  undefined1 local_30 [4];
  Result result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  char **argv_local;
  int argc_local;
  
  wabt::InitStdio();
  ParseOptions(argc,argv);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  wabt::string_view::string_view((string_view *)&lexer,s_infile);
  filename.size_ = (size_type)local_30;
  filename.data_ = local_40;
  local_34 = wabt::ReadFile((wabt *)lexer._M_t.
                                    super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>
                                    .super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl,
                            filename,in_RCX);
  wabt::string_view::string_view(&local_60,s_infile);
  size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  filename_01.size_ = (size_type)local_60.data_;
  filename_01.data_ = (char *)&local_50;
  wabt::WastLexer::CreateBufferLexer(filename_01,(void *)local_60.size_,(size_t)size);
  bVar1 = wabt::Failed(local_34);
  if (bVar1) {
    fprintf(_stderr,"unable to read file: %s\n",s_infile);
    exit(1);
  }
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&script);
  std::unique_ptr<wabt::Script,std::default_delete<wabt::Script>>::
  unique_ptr<std::default_delete<wabt::Script>,void>
            ((unique_ptr<wabt::Script,std::default_delete<wabt::Script>> *)
             &parse_wast_options.features.threads_enabled_);
  wabt::WastParseOptions::WastParseOptions((WastParseOptions *)local_95,&s_features);
  lexer_00 = std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::get(&local_50)
  ;
  options.features._4_4_ =
       wabt::ParseWastScript
                 (lexer_00,(unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *)
                           &parse_wast_options.features.threads_enabled_,(Errors *)&script,
                  (WastParseOptions *)local_95);
  options.features._8_4_ = options.features._4_4_;
  local_34 = (Result)options.features._4_4_;
  bVar1 = wabt::Succeeded((Result)options.features._4_4_);
  if ((bVar1) && ((s_validate & 1U) != 0)) {
    wabt::ValidateOptions::ValidateOptions((ValidateOptions *)local_ac,&s_features);
    pSVar4 = std::unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_>::get
                       ((unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *)
                        &parse_wast_options.features.threads_enabled_);
    local_b0 = (Enum)wabt::ValidateScript(pSVar4,(Errors *)&script,(ValidateOptions *)local_ac);
    local_34 = (Result)local_b0;
  }
  local_b4 = local_34.enum_;
  bVar1 = wabt::Succeeded(local_34);
  if (bVar1) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      wabt::string_view::string_view
                ((string_view *)
                 &module_streams.
                  super__Vector_base<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,s_infile);
      DefaultOuputName_abi_cxx11_(&local_d8,stack0xffffffffffffff18);
      std::__cxx11::string::operator=((string *)&s_outfile_abi_cxx11_,(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    std::vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>::
    vector((vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
            *)&json_stream.buf_);
    wabt::MemoryStream::MemoryStream
              ((MemoryStream *)((long)&output_basename.field_2 + 8),(Stream *)0x0);
    wabt::string_view::string_view(&local_168,&s_outfile_abi_cxx11_);
    filename_00.size_ = extraout_RDX;
    filename_00.data_ = (char *)local_168.size_;
    local_158 = wabt::StripExtension((wabt *)local_168.data_,filename_00);
    wabt::string_view::to_string_abi_cxx11_((string *)local_148,&local_158);
    s_write_binary_options.features.exceptions_enabled_ = s_features.exceptions_enabled_;
    s_write_binary_options.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
    s_write_binary_options.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_
    ;
    s_write_binary_options.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
    s_write_binary_options.features.simd_enabled_ = s_features.simd_enabled_;
    s_write_binary_options.features.threads_enabled_ = s_features.threads_enabled_;
    s_write_binary_options.features.multi_value_enabled_ = s_features.multi_value_enabled_;
    s_write_binary_options.features.tail_call_enabled_ = s_features.tail_call_enabled_;
    s_write_binary_options.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
    s_write_binary_options.features.reference_types_enabled_ = s_features.reference_types_enabled_;
    s_write_binary_options.features.annotations_enabled_ = s_features.annotations_enabled_;
    s_write_binary_options.features.gc_enabled_ = s_features.gc_enabled_;
    pSVar4 = std::unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_>::get
                       ((unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *)
                        &parse_wast_options.features.threads_enabled_);
    wabt::string_view::string_view(&local_180,s_infile);
    wabt::string_view::string_view(&local_190,(string *)local_148);
    log_stream = std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::get
                           (&s_log_stream);
    module_filename_noext.size_ = local_190.size_;
    module_filename_noext.data_ = local_190.data_;
    local_16c = (Enum)wabt::WriteBinarySpecScript
                                ((Stream *)((long)&output_basename.field_2 + 8),pSVar4,local_180,
                                 module_filename_noext,&s_write_binary_options,
                                 (vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
                                  *)&json_stream.buf_,&log_stream->super_Stream);
    local_34 = (Result)local_16c;
    wabt::string_view::string_view(&local_1a0,&s_outfile_abi_cxx11_);
    iter._M_current._4_4_ =
         wabt::MemoryStream::WriteToFile
                   ((MemoryStream *)((long)&output_basename.field_2 + 8),local_1a0);
    local_1b0._M_current =
         (FilenameMemoryStreamPair *)
         std::
         vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>::
         begin((vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
                *)&json_stream.buf_);
    while( true ) {
      local_1b8._M_current =
           (FilenameMemoryStreamPair *)
           std::
           vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>::
           end((vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
                *)&json_stream.buf_);
      bVar1 = __gnu_cxx::operator!=(&local_1b0,&local_1b8);
      if (!bVar1) break;
      pFVar5 = __gnu_cxx::
               __normal_iterator<wabt::FilenameMemoryStreamPair_*,_std::vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>_>
               ::operator->(&local_1b0);
      this = std::unique_ptr<wabt::MemoryStream,_std::default_delete<wabt::MemoryStream>_>::
             operator->(&pFVar5->stream);
      pFVar5 = __gnu_cxx::
               __normal_iterator<wabt::FilenameMemoryStreamPair_*,_std::vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>_>
               ::operator->(&local_1b0);
      wabt::string_view::string_view(&local_1c8,&pFVar5->filename);
      line_finder._M_t.
      super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
      ._M_t.
      super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
      .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl._4_4_ =
           wabt::MemoryStream::WriteToFile(this,local_1c8);
      __gnu_cxx::
      __normal_iterator<wabt::FilenameMemoryStreamPair_*,_std::vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>_>
      ::operator++(&local_1b0);
    }
    std::__cxx11::string::~string((string *)local_148);
    wabt::MemoryStream::~MemoryStream((MemoryStream *)((long)&output_basename.field_2 + 8));
    std::vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>::
    ~vector((vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
             *)&json_stream.buf_);
  }
  std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::operator->(&local_50);
  wabt::WastLexer::MakeLineFinder((WastLexer *)local_1d8);
  line_finder_00 =
       std::
       unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>::
       get((unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
            *)local_1d8);
  file = _stderr;
  std::__cxx11::string::string((string *)&local_1f8);
  wabt::FormatErrorsToFile((Errors *)&script,Text,line_finder_00,(FILE *)file,&local_1f8,Never,0x50)
  ;
  std::__cxx11::string::~string((string *)&local_1f8);
  EVar2 = wabt::Result::operator_cast_to_Enum(&local_34);
  std::unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>::
  ~unique_ptr((unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
               *)local_1d8);
  std::unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_>::~unique_ptr
            ((unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *)
             &parse_wast_options.features.threads_enabled_);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&script);
  std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::~unique_ptr(&local_50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return (uint)(EVar2 != Ok);
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();

  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  Result result = ReadFile(s_infile, &file_data);
  std::unique_ptr<WastLexer> lexer = WastLexer::CreateBufferLexer(
      s_infile, file_data.data(), file_data.size());
  if (Failed(result)) {
    WABT_FATAL("unable to read file: %s\n", s_infile);
  }

  Errors errors;
  std::unique_ptr<Script> script;
  WastParseOptions parse_wast_options(s_features);
  result = ParseWastScript(lexer.get(), &script, &errors, &parse_wast_options);

  if (Succeeded(result) && s_validate) {
    ValidateOptions options(s_features);
    result = ValidateScript(script.get(), &errors, options);
  }

  if (Succeeded(result)) {
    if (s_outfile.empty()) {
      s_outfile = DefaultOuputName(s_infile);
    }

    std::vector<FilenameMemoryStreamPair> module_streams;
    MemoryStream json_stream;

    std::string output_basename = StripExtension(s_outfile).to_string();
    s_write_binary_options.features = s_features;
    result = WriteBinarySpecScript(&json_stream, script.get(), s_infile,
                                   output_basename, s_write_binary_options,
                                   &module_streams, s_log_stream.get());

    json_stream.WriteToFile(s_outfile);

    for (auto iter = module_streams.begin(); iter != module_streams.end();
         ++iter) {
      iter->stream->WriteToFile(iter->filename);
    }
  }

  auto line_finder = lexer->MakeLineFinder();
  FormatErrorsToFile(errors, Location::Type::Text, line_finder.get());

  return result != Result::Ok;
}